

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O2

void __thiscall hwtest::pgraph::MthdKelvinClipidId::emulate_mthd(MthdKelvinClipidId *this)

{
  pgraph_state *state;
  _Bool _Var1;
  uint val;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_kelvin_check_err19(state);
  _Var1 = nv04_pgraph_is_kelvin_class(state);
  if (_Var1) {
    pgraph_kelvin_check_err18(state);
  }
  if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource != 0) {
    return;
  }
  val = (uint)(byte)(this->super_SingleMthdTest).super_MthdTest.val;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_clipid_id = val;
  pgraph_bundle(state,0x44,0,val,true);
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		if (nv04_pgraph_is_kelvin_class(&exp))
			pgraph_kelvin_check_err18(&exp);
		if (!exp.nsource) {
			exp.bundle_clipid_id = val & 0xff;
			pgraph_bundle(&exp, BUNDLE_CLIPID_ID, 0, exp.bundle_clipid_id, true);
		}
	}